

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<4>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float fVar2;
  deInt32 v;
  deInt32 v_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  int *piVar7;
  deInt64 dVar8;
  deInt64 dVar9;
  long *plVar10;
  deUint64 dVar11;
  FragmentPacket *pFVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  bool local_4e1;
  bool local_4b9;
  bool local_491;
  bool local_461;
  Vector<long,_4> *local_438;
  long *local_420;
  long *local_3f8;
  Vector<float,_4> local_3d4;
  undefined8 local_3c4;
  undefined8 local_3bc;
  undefined8 local_3b4;
  undefined8 local_3ac;
  undefined8 local_3a4;
  undefined8 local_39c;
  Vector<int,_2> local_394;
  Vector<float,_4> local_38c;
  undefined1 local_37c [8];
  Vec4 bSum;
  Vec4 b2;
  Vec4 b1;
  Vec4 b0;
  int i;
  Vec4 e20f_1;
  Vec4 e12f_1;
  Vec4 e01f_1;
  FragmentPacket *packet;
  Vec4 z1;
  Vec4 z0;
  undefined1 local_2d0 [8];
  Vec4 edgeSum;
  Vec4 *e20f;
  Vector<float,_4> *local_298;
  Vec4 *e12f;
  Vector<float,_4> *local_280;
  Vec4 *e01f;
  int local_270;
  int sampleNdx_2;
  int sampleNdx_1;
  int fragNdx;
  deInt64 oy;
  deInt64 ox;
  deUint64 dStack_250;
  int sampleNdx;
  deUint64 coverage;
  Vector<long,_4> e20 [4];
  Vector<long,_4> e12 [4];
  Vector<long,_4> e01 [4];
  bool outY1;
  bool outX1;
  deInt64 sy [4];
  deInt64 sx [4];
  deInt64 sy1;
  deInt64 sy0;
  deInt64 sx1;
  deInt64 sx0;
  int y0;
  int x0;
  float zc;
  float zb;
  float za;
  int packetNdx;
  deUint64 halfPixel;
  deInt64 *samplePos;
  int *numPacketsRasterized_local;
  int maxFragmentPackets_local;
  float *depthValues_local;
  FragmentPacket *fragmentPackets_local;
  TriangleRasterizer *this_local;
  
  zb = 0.0;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v0);
  fVar15 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v2);
  fVar15 = fVar15 - *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v1);
  fVar16 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v2);
  fVar16 = fVar16 - *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::z(&this->m_v2);
  fVar1 = *pfVar6;
  while( true ) {
    piVar7 = tcu::Vector<int,_2>::y(&this->m_curPos);
    iVar4 = *piVar7;
    piVar7 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
    if (*piVar7 < iVar4 || maxFragmentPackets <= (int)zb) break;
    piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
    v = *piVar7;
    piVar7 = tcu::Vector<int,_2>::y(&this->m_curPos);
    v_00 = *piVar7;
    dVar8 = toSubpixelCoord(v);
    toSubpixelCoord(v + 1);
    dVar9 = toSubpixelCoord(v_00);
    sy[1] = toSubpixelCoord(v_00 + 1);
    sy[0] = dVar9;
    sy[2] = sy[1];
    sy[3] = dVar8;
    iVar4 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar5 = tcu::Vector<int,_4>::z(&this->m_viewport);
    bVar13 = v + 1 != iVar4 + iVar5;
    iVar4 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar5 = tcu::Vector<int,_4>::w(&this->m_viewport);
    bVar14 = v_00 + 1 != iVar4 + iVar5;
    local_3f8 = e12[3].m_data + 3;
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)local_3f8);
      local_3f8 = local_3f8 + 4;
    } while (local_3f8 != e01[3].m_data + 3);
    local_420 = e20[3].m_data + 3;
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)local_420);
      local_420 = local_420 + 4;
    } while (local_420 != e12[3].m_data + 3);
    local_438 = (Vector<long,_4> *)&coverage;
    do {
      tcu::Vector<long,_4>::Vector(local_438);
      local_438 = local_438 + 1;
    } while (local_438 != (Vector<long,_4> *)(e20[3].m_data + 3));
    dStack_250 = 0;
    for (ox._4_4_ = 0; ox._4_4_ < 4; ox._4_4_ = ox._4_4_ + 1) {
      oy = *(deInt64 *)(s_samplePos4 + (long)(ox._4_4_ << 1) * 8);
      _sampleNdx_1 = *(long *)(s_samplePos4 + (long)(ox._4_4_ * 2 + 1) * 8);
      for (sampleNdx_2 = 0; sampleNdx_2 < 4; sampleNdx_2 = sampleNdx_2 + 1) {
        dVar8 = evaluateEdge(&this->m_edge01,sy[(long)sampleNdx_2 + 3] + oy,
                             sy[(long)sampleNdx_2 + -1] + _sampleNdx_1);
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e12[(long)ox._4_4_ + 3].m_data + 3),sampleNdx_2);
        *plVar10 = dVar8;
        dVar8 = evaluateEdge(&this->m_edge12,sy[(long)sampleNdx_2 + 3] + oy,
                             sy[(long)sampleNdx_2 + -1] + _sampleNdx_1);
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e20[(long)ox._4_4_ + 3].m_data + 3),sampleNdx_2);
        *plVar10 = dVar8;
        dVar8 = evaluateEdge(&this->m_edge20,sy[(long)sampleNdx_2 + 3] + oy,
                             sy[(long)sampleNdx_2 + -1] + _sampleNdx_1);
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e20[(long)ox._4_4_ + -1].m_data + 3),sampleNdx_2);
        *plVar10 = dVar8;
      }
    }
    for (local_270 = 0; dVar11 = dStack_250, iVar4 = local_270, local_270 < 4;
        local_270 = local_270 + 1) {
      plVar10 = tcu::Vector<long,_4>::operator[]
                          ((Vector<long,_4> *)(e12[(long)local_270 + 3].m_data + 3),0);
      bVar3 = isInsideCCW(&this->m_edge01,*plVar10);
      local_461 = false;
      if (bVar3) {
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e20[(long)local_270 + 3].m_data + 3),0);
        bVar3 = isInsideCCW(&this->m_edge12,*plVar10);
        local_461 = false;
        if (bVar3) {
          plVar10 = tcu::Vector<long,_4>::operator[]
                              ((Vector<long,_4> *)(e20[(long)local_270 + -1].m_data + 3),0);
          local_461 = isInsideCCW(&this->m_edge20,*plVar10);
        }
      }
      dVar11 = setCoverageValue(dVar11,4,0,0,iVar4,local_461);
      iVar4 = local_270;
      local_491 = false;
      dStack_250 = dVar11;
      if (bVar13) {
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e12[(long)local_270 + 3].m_data + 3),1);
        bVar3 = isInsideCCW(&this->m_edge01,*plVar10);
        local_491 = false;
        if (bVar3) {
          plVar10 = tcu::Vector<long,_4>::operator[]
                              ((Vector<long,_4> *)(e20[(long)local_270 + 3].m_data + 3),1);
          bVar3 = isInsideCCW(&this->m_edge12,*plVar10);
          local_491 = false;
          if (bVar3) {
            plVar10 = tcu::Vector<long,_4>::operator[]
                                ((Vector<long,_4> *)(e20[(long)local_270 + -1].m_data + 3),1);
            local_491 = isInsideCCW(&this->m_edge20,*plVar10);
          }
        }
      }
      dVar11 = setCoverageValue(dVar11,4,1,0,iVar4,local_491);
      iVar4 = local_270;
      local_4b9 = false;
      dStack_250 = dVar11;
      if (bVar14) {
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e12[(long)local_270 + 3].m_data + 3),2);
        bVar3 = isInsideCCW(&this->m_edge01,*plVar10);
        local_4b9 = false;
        if (bVar3) {
          plVar10 = tcu::Vector<long,_4>::operator[]
                              ((Vector<long,_4> *)(e20[(long)local_270 + 3].m_data + 3),2);
          bVar3 = isInsideCCW(&this->m_edge12,*plVar10);
          local_4b9 = false;
          if (bVar3) {
            plVar10 = tcu::Vector<long,_4>::operator[]
                                ((Vector<long,_4> *)(e20[(long)local_270 + -1].m_data + 3),2);
            local_4b9 = isInsideCCW(&this->m_edge20,*plVar10);
          }
        }
      }
      dVar11 = setCoverageValue(dVar11,4,0,1,iVar4,local_4b9);
      iVar4 = local_270;
      local_4e1 = false;
      dStack_250 = dVar11;
      if ((bVar13) && (local_4e1 = false, bVar14)) {
        plVar10 = tcu::Vector<long,_4>::operator[]
                            ((Vector<long,_4> *)(e12[(long)local_270 + 3].m_data + 3),3);
        bVar3 = isInsideCCW(&this->m_edge01,*plVar10);
        local_4e1 = false;
        if (bVar3) {
          plVar10 = tcu::Vector<long,_4>::operator[]
                              ((Vector<long,_4> *)(e20[(long)local_270 + 3].m_data + 3),3);
          bVar3 = isInsideCCW(&this->m_edge12,*plVar10);
          local_4e1 = false;
          if (bVar3) {
            plVar10 = tcu::Vector<long,_4>::operator[]
                                ((Vector<long,_4> *)(e20[(long)local_270 + -1].m_data + 3),3);
            local_4e1 = isInsideCCW(&this->m_edge20,*plVar10);
          }
        }
      }
      dStack_250 = setCoverageValue(dVar11,4,1,1,iVar4,local_4e1);
    }
    piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
    *piVar7 = *piVar7 + 2;
    piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
    iVar4 = *piVar7;
    piVar7 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
    if (*piVar7 < iVar4) {
      piVar7 = tcu::Vector<int,_2>::y(&this->m_curPos);
      *piVar7 = *piVar7 + 2;
      piVar7 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
      iVar4 = *piVar7;
      piVar7 = tcu::Vector<int,_2>::x(&this->m_curPos);
      *piVar7 = iVar4;
    }
    if (dStack_250 != 0) {
      if (depthValues != (float *)0x0) {
        for (e01f._4_4_ = 0; e01f._4_4_ < 4; e01f._4_4_ = e01f._4_4_ + 1) {
          tcu::Vector<long,_4>::asFloat((Vector<long,_4> *)&e12f);
          local_280 = (Vector<float,_4> *)&e12f;
          tcu::Vector<long,_4>::asFloat((Vector<long,_4> *)&e20f);
          local_298 = (Vector<float,_4> *)&e20f;
          tcu::Vector<long,_4>::asFloat((Vector<long,_4> *)(edgeSum.m_data + 2));
          tcu::operator+((tcu *)(z0.m_data + 2),local_280,local_298);
          tcu::operator+((tcu *)local_2d0,(Vector<float,_4> *)(z0.m_data + 2),
                         (Vector<float,_4> *)(edgeSum.m_data + 2));
          tcu::operator/((tcu *)(z1.m_data + 2),local_298,(Vector<float,_4> *)local_2d0);
          tcu::operator/((tcu *)&packet,(Vector<float,_4> *)(edgeSum.m_data + 2),
                         (Vector<float,_4> *)local_2d0);
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),0);
          fVar2 = *pfVar6;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&packet,0);
          depthValues[(int)zb * 0x10 + e01f._4_4_] = fVar2 * fVar15 + *pfVar6 * fVar16 + fVar1;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),1);
          fVar2 = *pfVar6;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&packet,1);
          depthValues[((int)zb * 4 + 1) * 4 + e01f._4_4_] =
               fVar2 * fVar15 + *pfVar6 * fVar16 + fVar1;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),2);
          fVar2 = *pfVar6;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&packet,2);
          depthValues[((int)zb * 4 + 2) * 4 + e01f._4_4_] =
               fVar2 * fVar15 + *pfVar6 * fVar16 + fVar1;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(z1.m_data + 2),3);
          fVar2 = *pfVar6;
          pfVar6 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&packet,3);
          depthValues[((int)zb * 4 + 3) * 4 + e01f._4_4_] =
               fVar2 * fVar15 + *pfVar6 * fVar16 + fVar1;
        }
      }
      pFVar12 = fragmentPackets + (int)zb;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(e12f_1.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(e20f_1.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(b0.m_data + 3));
      for (b0.m_data[2] = 0.0; (int)b0.m_data[2] < 4; b0.m_data[2] = (float)((int)b0.m_data[2] + 1))
      {
        dVar8 = evaluateEdge(&this->m_edge01,sy[(long)(int)b0.m_data[2] + 3] + 0x80,
                             sy[(long)(int)b0.m_data[2] + -1] + 0x80);
        pfVar6 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(e12f_1.m_data + 2),(int)b0.m_data[2]);
        *pfVar6 = (float)dVar8;
        dVar8 = evaluateEdge(&this->m_edge12,sy[(long)(int)b0.m_data[2] + 3] + 0x80,
                             sy[(long)(int)b0.m_data[2] + -1] + 0x80);
        pfVar6 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(e20f_1.m_data + 2),(int)b0.m_data[2]);
        *pfVar6 = (float)dVar8;
        dVar8 = evaluateEdge(&this->m_edge20,sy[(long)(int)b0.m_data[2] + 3] + 0x80,
                             sy[(long)(int)b0.m_data[2] + -1] + 0x80);
        pfVar6 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(b0.m_data + 3),(int)b0.m_data[2]);
        *pfVar6 = (float)dVar8;
      }
      pfVar6 = tcu::Vector<float,_4>::w(&this->m_v0);
      tcu::operator*((tcu *)(b1.m_data + 2),(Vector<float,_4> *)(e20f_1.m_data + 2),*pfVar6);
      pfVar6 = tcu::Vector<float,_4>::w(&this->m_v1);
      tcu::operator*((tcu *)(b2.m_data + 2),(Vector<float,_4> *)(b0.m_data + 3),*pfVar6);
      pfVar6 = tcu::Vector<float,_4>::w(&this->m_v2);
      tcu::operator*((tcu *)(bSum.m_data + 2),(Vector<float,_4> *)(e12f_1.m_data + 2),*pfVar6);
      tcu::operator+((tcu *)&local_38c,(Vector<float,_4> *)(b1.m_data + 2),
                     (Vector<float,_4> *)(b2.m_data + 2));
      tcu::operator+((tcu *)local_37c,&local_38c,(Vector<float,_4> *)(bSum.m_data + 2));
      tcu::Vector<int,_2>::Vector(&local_394,v,v_00);
      *&(pFVar12->position).m_data = local_394.m_data;
      pFVar12->coverage = dStack_250;
      tcu::operator/((tcu *)&local_3a4,(Vector<float,_4> *)(b1.m_data + 2),
                     (Vector<float,_4> *)local_37c);
      *(undefined8 *)pFVar12->barycentric[0].m_data = local_3a4;
      *(undefined8 *)(pFVar12->barycentric[0].m_data + 2) = local_39c;
      tcu::operator/((tcu *)&local_3b4,(Vector<float,_4> *)(b2.m_data + 2),
                     (Vector<float,_4> *)local_37c);
      *(undefined8 *)pFVar12->barycentric[1].m_data = local_3b4;
      *(undefined8 *)(pFVar12->barycentric[1].m_data + 2) = local_3ac;
      tcu::operator-((tcu *)&local_3d4,1.0,pFVar12->barycentric);
      tcu::operator-((tcu *)&local_3c4,&local_3d4,pFVar12->barycentric + 1);
      *(undefined8 *)pFVar12->barycentric[2].m_data = local_3c4;
      *(undefined8 *)(pFVar12->barycentric[2].m_data + 2) = local_3bc;
      zb = (float)((int)zb + 1);
    }
  }
  *numPacketsRasterized = (int)zb;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}